

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references.cpp
# Opt level: O3

void CreateBackwardReferencesDH55
               (size_t num_bytes,size_t position,uint8_t *ringbuffer,size_t ringbuffer_mask,
               ContextLut literal_context_lut,BrotliEncoderParams *params,Hasher *hasher,
               int *dist_cache,size_t *last_insert_len,Command *commands,size_t *num_commands,
               size_t *num_literals)

{
  undefined1 *puVar1;
  undefined1 *puVar2;
  ulong *puVar3;
  long lVar4;
  PreparedDictionary *pPVar5;
  byte bVar6;
  ushort uVar7;
  int iVar8;
  long lVar9;
  long lVar10;
  size_t sVar11;
  int *piVar12;
  PreparedDictionary *pPVar13;
  int iVar14;
  int iVar15;
  uint uVar16;
  uint32_t *puVar17;
  uint8_t uVar18;
  ulong uVar19;
  undefined8 *puVar20;
  undefined1 *puVar21;
  long lVar22;
  uint8_t *puVar23;
  uint uVar24;
  uint uVar25;
  PreparedDictionary *pPVar26;
  uint8_t *puVar27;
  long lVar28;
  uint *puVar29;
  undefined1 *puVar30;
  PreparedDictionary *pPVar31;
  uint8_t *s1_orig_2;
  ulong uVar32;
  ulong *puVar33;
  uint8_t *puVar34;
  long lVar35;
  short sVar36;
  long lVar37;
  ulong uVar38;
  PreparedDictionary *pPVar39;
  PreparedDictionary *pPVar40;
  byte bVar41;
  uint uVar42;
  long lVar43;
  ulong *puVar44;
  PreparedDictionary *pPVar45;
  PreparedDictionary *pPVar46;
  PreparedDictionary *pPVar47;
  long lVar48;
  long lVar49;
  int iVar50;
  ulong uVar51;
  long lVar52;
  uint uVar53;
  PreparedDictionary *pPVar54;
  ulong uVar55;
  ulong *puVar56;
  ulong *puVar57;
  uint8_t *s1_orig_3;
  PreparedDictionary *pPVar58;
  ulong uVar59;
  uint8_t *puVar60;
  uint8_t *s1_orig;
  ulong uVar61;
  ulong uVar62;
  ulong local_198;
  ulong local_188;
  ulong local_178;
  PreparedDictionary *local_160;
  PreparedDictionary *local_158;
  ulong local_150;
  ulong local_148;
  size_t *local_128;
  ulong local_110;
  PreparedDictionary *local_e8;
  ulong auStack_58 [5];
  
  pPVar5 = (PreparedDictionary *)((position - 7) + num_bytes);
  pPVar47 = (PreparedDictionary *)position;
  if (7 < num_bytes) {
    pPVar47 = pPVar5;
  }
  lVar48 = 0x200;
  if (*(int *)(literal_context_lut + 4) < 9) {
    lVar48 = 0x40;
  }
  local_198 = *(ulong *)dist_cache;
  puVar2 = (undefined1 *)(position + num_bytes);
  if (puVar2 <= (undefined1 *)(position + 8)) {
    local_128 = last_insert_len;
LAB_01109f74:
    *(undefined1 **)dist_cache = puVar2 + (local_198 - position);
    *(long *)commands = *(long *)commands + ((long)local_128 - (long)last_insert_len >> 4);
    return;
  }
  pPVar54 = (PreparedDictionary *)((1L << (literal_context_lut[8] & 0x3f)) + -0x10);
  lVar9 = *(long *)(literal_context_lut + 0x10);
  lVar10 = *(long *)(literal_context_lut + 0x60);
  pPVar40 = (PreparedDictionary *)(lVar48 + position);
  sVar11 = (params->dictionary).compound.num_chunks;
  uVar16 = (uint)ringbuffer_mask;
  lVar4 = position - 1;
  local_128 = last_insert_len;
  pPVar39 = (PreparedDictionary *)position;
LAB_01108868:
  uVar62 = (long)puVar2 - (long)pPVar39;
  pPVar31 = pPVar54;
  if (pPVar39 < pPVar54) {
    pPVar31 = pPVar39;
  }
  pPVar26 = (PreparedDictionary *)((long)&pPVar39->magic + lVar9);
  if (pPVar54 <= pPVar26) {
    pPVar26 = pPVar54;
  }
  uVar19 = (ulong)pPVar39 & ringbuffer_mask;
  puVar3 = (ulong *)(ringbuffer + uVar19);
  uVar18 = ringbuffer[uVar19];
  local_160 = (PreparedDictionary *)(long)*(int *)(hasher->common).extra;
  local_178 = 0x7e4;
  if (((PreparedDictionary *)((long)pPVar39 - (long)local_160) < pPVar39) &&
     (uVar24 = (uint)(PreparedDictionary *)((long)pPVar39 - (long)local_160) & uVar16,
     uVar18 == ringbuffer[uVar24])) {
    puVar27 = ringbuffer + uVar24;
    puVar34 = puVar27;
    uVar38 = uVar62;
    puVar44 = puVar3;
    if (7 < uVar62) {
      lVar43 = 0;
      lVar37 = 0;
LAB_011088f7:
      if (*(ulong *)((long)puVar3 + lVar43) == *(ulong *)(puVar27 + lVar43)) goto code_r0x01108904;
      uVar51 = *(ulong *)(puVar27 + lVar43) ^ *(ulong *)((long)puVar3 + lVar43);
      uVar38 = 0;
      if (uVar51 != 0) {
        for (; (uVar51 >> uVar38 & 1) == 0; uVar38 = uVar38 + 1) {
        }
      }
      local_110 = (uVar38 >> 3 & 0x1fffffff) - lVar37;
      goto LAB_01108971;
    }
    goto LAB_0110892e;
  }
  goto LAB_01108999;
code_r0x01108904:
  lVar43 = lVar43 + 8;
  lVar28 = uVar62 + lVar37;
  lVar37 = lVar37 + -8;
  if (lVar28 - 8U < 8) goto code_r0x0110891a;
  goto LAB_011088f7;
code_r0x0110891a:
  puVar34 = puVar27 + -lVar37;
  puVar44 = (ulong *)((long)puVar3 - lVar37);
  uVar38 = lVar37 + uVar62;
LAB_0110892e:
  if (uVar38 != 0) {
    uVar51 = 0;
    do {
      uVar55 = uVar51;
      if (puVar34[uVar51] != *(uint8_t *)((long)puVar44 + uVar51)) break;
      uVar51 = uVar51 + 1;
      uVar55 = uVar38;
    } while (uVar38 != uVar51);
    puVar34 = puVar34 + uVar55;
  }
  local_110 = (long)puVar34 - (long)puVar27;
LAB_01108971:
  if ((local_110 < 4) || (uVar38 = local_110 * 0x87 + 0x78f, uVar38 < 0x7e5)) {
LAB_01108999:
    local_160 = (PreparedDictionary *)0x0;
    local_110 = 0;
  }
  else {
    uVar18 = *(uint8_t *)((long)puVar3 + local_110);
    local_178 = uVar38;
  }
  uVar24 = (uint)((ulong)(*(long *)(ringbuffer + uVar19) * -0x1ca5842ca8642d00) >> 0x2c);
  lVar28 = 0;
  lVar37 = 0;
  lVar43 = 1;
  do {
    auStack_58[lVar28] = lVar37 * 8 + (ulong)uVar24 & 0xfffff;
    auStack_58[lVar28 + 1] = lVar43 * 8 + (ulong)uVar24 & 0xfffff;
    lVar28 = lVar28 + 2;
    lVar37 = lVar37 + 2;
    lVar43 = lVar43 + 2;
  } while (lVar28 != 4);
  uVar24 = (uint)pPVar39;
  lVar37 = 0;
LAB_01108a1a:
  uVar53 = *(uint *)(sVar11 + auStack_58[lVar37] * 4);
  puVar34 = ringbuffer + (uVar16 & uVar53);
  if (((uVar18 == puVar34[local_110]) && (pPVar39 != (PreparedDictionary *)(ulong)uVar53)) &&
     (pPVar45 = (PreparedDictionary *)((long)pPVar39 - (long)(ulong)uVar53), pPVar45 <= pPVar31)) {
    uVar38 = uVar62;
    puVar44 = puVar3;
    puVar27 = puVar34;
    if (7 < uVar62) {
      lVar28 = 0;
      lVar43 = 0;
LAB_01108a6d:
      if (*(ulong *)((long)puVar3 + lVar28) == *(ulong *)(puVar34 + lVar28)) goto code_r0x01108a7a;
      uVar51 = *(ulong *)(puVar34 + lVar28) ^ *(ulong *)((long)puVar3 + lVar28);
      uVar38 = 0;
      if (uVar51 != 0) {
        for (; (uVar51 >> uVar38 & 1) == 0; uVar38 = uVar38 + 1) {
        }
      }
      uVar38 = (uVar38 >> 3 & 0x1fffffff) - lVar43;
      goto LAB_01108ae8;
    }
    goto LAB_01108a9f;
  }
  goto LAB_01108b20;
code_r0x01108a7a:
  lVar28 = lVar28 + 8;
  lVar49 = uVar62 + lVar43;
  lVar43 = lVar43 + -8;
  if (lVar49 - 8U < 8) goto code_r0x01108a90;
  goto LAB_01108a6d;
code_r0x01108a90:
  puVar27 = puVar34 + -lVar43;
  puVar44 = (ulong *)((long)puVar3 - lVar43);
  uVar38 = lVar43 + uVar62;
LAB_01108a9f:
  if (uVar38 != 0) {
    uVar51 = 0;
    do {
      uVar55 = uVar51;
      if (puVar27[uVar51] != *(uint8_t *)((long)puVar44 + uVar51)) break;
      uVar51 = uVar51 + 1;
      uVar55 = uVar38;
    } while (uVar38 != uVar51);
    puVar27 = puVar27 + uVar55;
  }
  uVar38 = (long)puVar27 - (long)puVar34;
LAB_01108ae8:
  if (3 < uVar38) {
    iVar50 = 0x1f;
    if ((uint)pPVar45 != 0) {
      for (; (uint)pPVar45 >> iVar50 == 0; iVar50 = iVar50 + -1) {
      }
    }
    uVar51 = (ulong)(iVar50 * -0x1e + 0x780) + uVar38 * 0x87;
    if (local_178 < uVar51) {
      uVar18 = *(uint8_t *)((long)puVar3 + uVar38);
      local_110 = uVar38;
      local_178 = uVar51;
      local_160 = pPVar45;
    }
  }
LAB_01108b20:
  lVar37 = lVar37 + 1;
  if (lVar37 == 4) goto code_r0x01108b32;
  goto LAB_01108a1a;
code_r0x01108b32:
  *(uint *)(sVar11 + *(long *)((long)auStack_58 + (ulong)(uVar24 & 0x18)) * 4) = uVar24;
  if (0x1f < uVar62 && ((ulong)pPVar39 & 3) == 0) {
    pPVar45 = (params->dictionary).compound.chunks[1];
    if (pPVar45 <= pPVar39) {
      uVar53 = (uint)(params->dictionary).compound.total_size;
      iVar50 = *(int *)((long)(params->dictionary).compound.chunks + 0x14);
      iVar14 = *(int *)((params->dictionary).compound.chunks + 3);
LAB_01108b7b:
      uVar42 = uVar53 & 0x3fffffff;
      bVar41 = ringbuffer[(ulong)pPVar45 & ringbuffer_mask];
      bVar6 = ringbuffer[(ulong)&pPVar45[1].source_size & ringbuffer_mask];
      if (uVar42 < 0x1000000) {
        pPVar58 = (params->dictionary).compound.chunks[0];
        uVar25 = (&pPVar58->magic)[uVar42];
        (&pPVar58->magic)[uVar42] = (uint32_t)pPVar45;
        if ((pPVar45 == pPVar39) && (uVar25 != 0xffffffff)) {
          uVar42 = uVar24 - uVar25;
          if ((PreparedDictionary *)(ulong)uVar42 <= pPVar31) {
            puVar34 = ringbuffer + (uVar25 & uVar16);
            lVar43 = 0;
            lVar37 = 0;
LAB_01108c13:
            lVar28 = lVar37;
            if (*(ulong *)((long)puVar3 + lVar43) == *(ulong *)(puVar34 + lVar43))
            goto code_r0x01108c23;
            uVar51 = *(ulong *)(puVar34 + lVar43) ^ *(ulong *)((long)puVar3 + lVar43);
            uVar38 = 0;
            if (uVar51 != 0) {
              for (; (uVar51 >> uVar38 & 1) == 0; uVar38 = uVar38 + 1) {
              }
            }
            uVar38 = lVar43 + (uVar38 >> 3 & 0x1fffffff);
            goto LAB_01108cb0;
          }
        }
      }
      goto LAB_01108bdd;
    }
    goto LAB_01108d16;
  }
  goto LAB_01108d23;
code_r0x01108c23:
  lVar43 = lVar43 + 8;
  lVar37 = lVar28 + -8;
  if ((uVar62 + lVar28) - 8 < 8) goto code_r0x01108c3e;
  goto LAB_01108c13;
code_r0x01108c3e:
  if (uVar62 - lVar43 == 0) {
    puVar27 = puVar34 + lVar43;
  }
  else {
    puVar27 = puVar34 + (uVar62 - lVar43) + lVar43;
    uVar38 = 8 - lVar28;
    do {
      if (puVar34[uVar38] != *(uint8_t *)((long)puVar3 + uVar38)) {
        puVar27 = puVar34 + uVar38;
        break;
      }
      uVar38 = uVar38 + 1;
    } while (uVar62 != uVar38);
  }
  uVar38 = (long)puVar27 - (long)puVar34;
LAB_01108cb0:
  if ((3 < uVar38) && (local_110 < uVar38)) {
    iVar8 = 0x1f;
    if (uVar42 != 0) {
      for (; uVar42 >> iVar8 == 0; iVar8 = iVar8 + -1) {
      }
    }
    uVar51 = (ulong)(iVar8 * -0x1e + 0x780) + uVar38 * 0x87;
    if (local_178 < uVar51) {
      local_110 = uVar38;
      local_178 = uVar51;
      local_160 = (PreparedDictionary *)(ulong)uVar42;
    }
  }
LAB_01108bdd:
  uVar53 = ~(uint)bVar41 * iVar14 + (uint)bVar6 + uVar53 * iVar50 + 1;
  pPVar45 = (PreparedDictionary *)&pPVar45->num_items;
  if (pPVar39 < pPVar45) goto LAB_01108d0e;
  goto LAB_01108b7b;
LAB_01108d0e:
  *(uint *)&(params->dictionary).compound.total_size = uVar53;
LAB_01108d16:
  (params->dictionary).compound.chunks[1] = (PreparedDictionary *)&pPVar39->num_items;
LAB_01108d23:
  pPVar31 = *(PreparedDictionary **)(literal_context_lut + 0x48);
  lVar37 = *(long *)(literal_context_lut + 0x58);
  lVar43 = *(long *)(literal_context_lut + 0x60);
  if (lVar37 != 0) {
    lVar28 = 0;
LAB_01108d5d:
    piVar12 = *(int **)(literal_context_lut + lVar28 * 8 + 0x68);
    uVar38 = ((*puVar3 << (-(char)piVar12[3] & 0x3fU)) >> (-(char)piVar12[3] & 0x3fU)) *
             0x1fe35a7bd3579bd3 >> (-*(byte *)(piVar12 + 4) & 0x3f);
    lVar49 = (1L << (*(byte *)(piVar12 + 5) & 0x3f)) * 4 + 0x18;
    lVar35 = (1L << (*(byte *)(piVar12 + 4) & 0x3f)) * 2 + lVar49;
    bVar41 = -*(byte *)(piVar12 + 5);
    puVar20 = (undefined8 *)((long)piVar12 + (ulong)(uint)piVar12[1] * 4 + lVar35);
    if (*piVar12 != -0x21431220) {
      puVar20 = (undefined8 *)*puVar20;
    }
    pPVar45 = (PreparedDictionary *)
              ((long)pPVar26 + (lVar43 - *(long *)(literal_context_lut + lVar28 * 8 + 0x168)));
    uVar51 = (ulong)(uint)piVar12[2];
    uVar7 = *(ushort *)((long)piVar12 + (uVar38 & 0xffffffff) * 2 + lVar49);
    puVar29 = (uint *)((long)piVar12 +
                      (ulong)((uint)uVar7 +
                             piVar12[(ulong)((uint)((int)uVar38 << (bVar41 & 0x1f)) >>
                                            (bVar41 & 0x1f)) + 6]) * 4 + lVar35);
    lVar49 = 0;
    uVar38 = local_110;
LAB_01108e1c:
    pPVar58 = (PreparedDictionary *)(long)*(int *)((long)(hasher->common).extra + lVar49 * 4);
    if (((PreparedDictionary *)((long)pPVar45 - uVar51) < pPVar58) && (pPVar58 <= pPVar45)) {
      uVar55 = uVar51 - ((long)pPVar45 - (long)pPVar58);
      if (uVar62 <= uVar55) {
        uVar55 = uVar62;
      }
      lVar22 = ((long)pPVar45 - (long)pPVar58) + (long)puVar20;
      puVar44 = puVar3;
      lVar35 = lVar22;
      if (7 < uVar55) {
        lVar35 = 0;
LAB_01108e52:
        if (*(ulong *)((long)puVar3 + lVar35) == *(ulong *)(lVar22 + lVar35)) goto code_r0x01108e5f;
        uVar59 = *(ulong *)(lVar22 + lVar35) ^ *(ulong *)((long)puVar3 + lVar35);
        uVar55 = 0;
        if (uVar59 != 0) {
          for (; (uVar59 >> uVar55 & 1) == 0; uVar55 = uVar55 + 1) {
          }
        }
        uVar55 = (uVar55 >> 3 & 0x1fffffff) + lVar35;
        goto LAB_01108ebb;
      }
      goto LAB_01108e7c;
    }
    goto LAB_01108f1e;
  }
LAB_01109095:
  if (0x7e4 < local_178) {
    uVar19 = local_198 + 4;
    local_148 = (lVar4 + num_bytes) - (long)pPVar39;
    pPVar40 = (PreparedDictionary *)((long)&pPVar39->magic + lVar9 + 1);
    iVar50 = 0;
LAB_011090f0:
    pPVar26 = pPVar54;
    if (pPVar40 < pPVar54) {
      pPVar26 = pPVar40;
    }
    uVar38 = uVar62 - 1;
    local_150 = local_110 - 1;
    if (uVar38 <= local_110 - 1) {
      local_150 = uVar38;
    }
    if (4 < *(int *)(literal_context_lut + 4)) {
      local_150 = 0;
    }
    pPVar45 = (PreparedDictionary *)((long)&pPVar39->magic + 1);
    pPVar58 = pPVar54;
    if (pPVar45 < pPVar54) {
      pPVar58 = pPVar45;
    }
    local_e8 = (PreparedDictionary *)((long)&pPVar39->magic + lVar9 + 1);
    if (pPVar54 <= local_e8) {
      local_e8 = pPVar54;
    }
    uVar51 = (ulong)pPVar45 & ringbuffer_mask;
    puVar3 = (ulong *)(ringbuffer + uVar51);
    uVar18 = *(uint8_t *)(local_150 + (long)puVar3);
    local_158 = (PreparedDictionary *)(long)*(int *)(hasher->common).extra;
    local_188 = 0x7e4;
    if (pPVar45 <= (PreparedDictionary *)((long)pPVar45 - (long)local_158)) {
      local_158 = (PreparedDictionary *)0x0;
      goto LAB_011092e7;
    }
    puVar34 = ringbuffer + ((uint)(PreparedDictionary *)((long)pPVar45 - (long)local_158) & uVar16);
    if (uVar18 != puVar34[local_150]) {
      local_158 = (PreparedDictionary *)0x0;
      goto LAB_011092e7;
    }
    puVar27 = puVar34;
    uVar55 = uVar38;
    puVar44 = puVar3;
    if (7 < uVar38) {
      lVar28 = 0;
      lVar49 = 0;
LAB_011091d3:
      if (*(ulong *)((long)puVar3 + lVar28) == *(ulong *)(puVar34 + lVar28)) goto code_r0x011091e5;
      uVar59 = *(ulong *)(puVar34 + lVar28) ^ *(ulong *)((long)puVar3 + lVar28);
      uVar55 = 0;
      if (uVar59 != 0) {
        for (; (uVar59 >> uVar55 & 1) == 0; uVar55 = uVar55 + 1) {
        }
      }
      uVar55 = (uVar55 >> 3 & 0x1fffffff) - lVar49;
      goto LAB_01109299;
    }
    goto LAB_0110921a;
  }
  local_198 = local_198 + 1;
  position = (long)&pPVar39->magic + 1;
  if (pPVar40 < position) {
    if ((PreparedDictionary *)((long)&pPVar40->magic + (ulong)(uint)((int)lVar48 * 4)) < position) {
      pPVar39 = (PreparedDictionary *)((long)&pPVar39->bucket_bits + 1);
      if (pPVar5 <= pPVar39) {
        pPVar39 = pPVar5;
      }
      for (; position < pPVar39; position = (size_t)&((PreparedDictionary *)position)->num_items) {
        *(uint *)(sVar11 + (ulong)((uint)((ulong)(*(long *)(ringbuffer +
                                                           (position & ringbuffer_mask)) *
                                                 -0x1ca5842ca8642d00) >> 0x2c) +
                                   ((uint)position & 0x18) & 0xfffff) * 4) = (uint)position;
        local_198 = local_198 + 4;
      }
    }
    else {
      pPVar39 = (PreparedDictionary *)((long)&pPVar39->source_size + 1);
      if (pPVar5 <= pPVar39) {
        pPVar39 = pPVar5;
      }
      for (; position < pPVar39; position = (long)&((PreparedDictionary *)position)->magic + 2) {
        *(uint *)(sVar11 + (ulong)((uint)((ulong)(*(long *)(ringbuffer +
                                                           (position & ringbuffer_mask)) *
                                                 -0x1ca5842ca8642d00) >> 0x2c) +
                                   ((uint)position & 0x18) & 0xfffff) * 4) = (uint)position;
        local_198 = local_198 + 2;
      }
    }
  }
LAB_01109f0f:
  pPVar39 = (PreparedDictionary *)position;
  if (puVar2 <= &((PreparedDictionary *)position)->source_size) goto LAB_01109f74;
  goto LAB_01108868;
code_r0x01108e5f:
  uVar55 = uVar55 - 8;
  lVar35 = lVar35 + 8;
  if (uVar55 < 8) goto code_r0x01108e6d;
  goto LAB_01108e52;
code_r0x01108e6d:
  puVar44 = (ulong *)(lVar35 + (long)puVar3);
  lVar35 = lVar22 + lVar35;
LAB_01108e7c:
  if (uVar55 != 0) {
    uVar59 = 0;
    do {
      uVar61 = uVar59;
      if (*(char *)(lVar35 + uVar59) != *(char *)((long)puVar44 + uVar59)) break;
      uVar59 = uVar59 + 1;
      uVar61 = uVar55;
    } while (uVar55 != uVar59);
    lVar35 = lVar35 + uVar61;
  }
  uVar55 = lVar35 - lVar22;
LAB_01108ebb:
  if ((1 < uVar55) && (uVar59 = uVar55 * 0x87 + 0x78f, local_178 < uVar59)) {
    if (lVar49 != 0) {
      uVar59 = uVar59 - ((0x1ca10U >> ((byte)lVar49 & 2) & 4) + 0x27);
    }
    if ((local_178 < uVar59) &&
       (local_178 = uVar59, local_160 = pPVar58, local_110 = uVar55, uVar38 < uVar55)) {
      uVar38 = uVar55;
    }
  }
LAB_01108f1e:
  lVar49 = lVar49 + 1;
  if (lVar49 == 4) goto code_r0x01108f2b;
  goto LAB_01108e1c;
code_r0x01108f2b:
  if (uVar7 != 0xffff) {
LAB_01109042:
    uVar24 = *puVar29;
    uVar59 = (ulong)(uVar24 & 0x7fffffff);
    pPVar58 = (PreparedDictionary *)((long)pPVar45 - uVar59);
    uVar55 = uVar51 - uVar59;
    if (uVar62 <= uVar51 - uVar59) {
      uVar55 = uVar62;
    }
    if ((((pPVar58 <= pPVar31) && (uVar19 + uVar38 <= ringbuffer_mask)) && (uVar38 < uVar55)) &&
       (ringbuffer[uVar19 + uVar38] == *(uint8_t *)((long)puVar20 + uVar59 + uVar38))) {
      puVar33 = (ulong *)(uVar59 + (long)puVar20);
      puVar44 = puVar33;
      puVar56 = puVar3;
      if (7 < uVar55) {
        lVar49 = 0;
        puVar57 = puVar33;
LAB_01108f8e:
        if (*puVar56 == *puVar57) goto code_r0x01108f99;
        uVar59 = *puVar57 ^ *puVar56;
        uVar55 = 0;
        if (uVar59 != 0) {
          for (; (uVar59 >> uVar55 & 1) == 0; uVar55 = uVar55 + 1) {
          }
        }
        uVar55 = (uVar55 >> 3 & 0x1fffffff) - lVar49;
        goto LAB_01108ff4;
      }
      goto LAB_01108fc0;
    }
    goto LAB_0110906d;
  }
LAB_01109075:
  lVar28 = lVar28 + 1;
  if (lVar28 == lVar37) goto LAB_01109095;
  goto LAB_01108d5d;
code_r0x01108f99:
  puVar56 = puVar56 + 1;
  puVar57 = puVar57 + 1;
  lVar35 = uVar55 + lVar49;
  lVar49 = lVar49 + -8;
  if (lVar35 - 8U < 8) goto code_r0x01108fb3;
  goto LAB_01108f8e;
code_r0x01108fb3:
  uVar55 = uVar55 + lVar49;
  puVar44 = puVar57;
  if (uVar55 != 0) {
LAB_01108fc0:
    puVar57 = (ulong *)((long)puVar44 + uVar55);
    uVar59 = 0;
    do {
      if (*(char *)((long)puVar44 + uVar59) != *(char *)((long)puVar56 + uVar59)) {
        puVar57 = (ulong *)((long)puVar44 + uVar59);
        break;
      }
      uVar59 = uVar59 + 1;
    } while (uVar55 != uVar59);
  }
  uVar55 = (long)puVar57 - (long)puVar33;
LAB_01108ff4:
  if (3 < uVar55) {
    iVar50 = 0x1f;
    if ((uint)pPVar58 != 0) {
      for (; (uint)pPVar58 >> iVar50 == 0; iVar50 = iVar50 + -1) {
      }
    }
    uVar59 = (ulong)(iVar50 * -0x1e + 0x780) + uVar55 * 0x87;
    if (local_178 < uVar59) {
      uVar38 = uVar55;
      local_178 = uVar59;
      local_160 = pPVar58;
      local_110 = uVar55;
    }
  }
LAB_0110906d:
  puVar29 = puVar29 + 1;
  if ((int)uVar24 < 0) goto LAB_01109075;
  goto LAB_01109042;
code_r0x011091e5:
  lVar28 = lVar28 + 8;
  lVar35 = local_148 + lVar49;
  lVar49 = lVar49 + -8;
  if (lVar35 - 8U < 8) goto code_r0x011091ff;
  goto LAB_011091d3;
code_r0x011091ff:
  puVar27 = puVar34 + -lVar49;
  puVar44 = (ulong *)((long)puVar3 - lVar49);
  uVar55 = lVar49 + local_148;
LAB_0110921a:
  if (uVar55 != 0) {
    uVar59 = 0;
    do {
      uVar61 = uVar59;
      if (puVar27[uVar59] != *(uint8_t *)((long)puVar44 + uVar59)) break;
      uVar59 = uVar59 + 1;
      uVar61 = uVar55;
    } while (uVar55 != uVar59);
    puVar27 = puVar27 + uVar61;
  }
  uVar55 = (long)puVar27 - (long)puVar34;
LAB_01109299:
  if (uVar55 < 4) {
    local_158 = (PreparedDictionary *)0x0;
  }
  else {
    uVar59 = uVar55 * 0x87 + 0x78f;
    if (uVar59 < 0x7e5) {
      local_158 = (PreparedDictionary *)0x0;
    }
    else {
      uVar18 = *(uint8_t *)((long)puVar3 + uVar55);
      local_150 = uVar55;
      local_188 = uVar59;
    }
  }
LAB_011092e7:
  uVar24 = (uint)((ulong)(*(long *)(ringbuffer + uVar51) * -0x1ca5842ca8642d00) >> 0x2c);
  lVar35 = 0;
  lVar28 = 0;
  lVar49 = 1;
  do {
    auStack_58[lVar35] = lVar28 * 8 + (ulong)uVar24 & 0xfffff;
    auStack_58[lVar35 + 1] = lVar49 * 8 + (ulong)uVar24 & 0xfffff;
    lVar35 = lVar35 + 2;
    lVar28 = lVar28 + 2;
    lVar49 = lVar49 + 2;
  } while (lVar35 != 4);
  uVar24 = (uint)pPVar45;
  lVar28 = 0;
LAB_01109344:
  uVar53 = *(uint *)(sVar11 + auStack_58[lVar28] * 4);
  puVar34 = ringbuffer + (uVar16 & uVar53);
  if (((uVar18 == puVar34[local_150]) && (pPVar45 != (PreparedDictionary *)(ulong)uVar53)) &&
     (pPVar46 = (PreparedDictionary *)((long)pPVar45 - (long)(ulong)uVar53), pPVar46 <= pPVar58)) {
    uVar55 = uVar38;
    puVar44 = puVar3;
    puVar27 = puVar34;
    if (7 < uVar38) {
      lVar49 = 0;
      lVar35 = 0;
LAB_0110939f:
      if (*(ulong *)((long)puVar3 + lVar49) == *(ulong *)(puVar34 + lVar49)) goto code_r0x011093ad;
      uVar59 = *(ulong *)(puVar34 + lVar49) ^ *(ulong *)((long)puVar3 + lVar49);
      uVar55 = 0;
      if (uVar59 != 0) {
        for (; (uVar59 >> uVar55 & 1) == 0; uVar55 = uVar55 + 1) {
        }
      }
      uVar55 = (uVar55 >> 3 & 0x1fffffff) - lVar35;
      goto LAB_01109420;
    }
    goto LAB_011093dd;
  }
  goto LAB_0110945e;
code_r0x011093ad:
  lVar49 = lVar49 + 8;
  lVar22 = local_148 + lVar35;
  lVar35 = lVar35 + -8;
  if (lVar22 - 8U < 8) goto code_r0x011093c7;
  goto LAB_0110939f;
code_r0x011093c7:
  puVar27 = puVar34 + -lVar35;
  puVar44 = (ulong *)((long)puVar3 - lVar35);
  uVar55 = lVar35 + local_148;
LAB_011093dd:
  if (uVar55 != 0) {
    uVar59 = 0;
    do {
      uVar61 = uVar59;
      if (puVar27[uVar59] != *(uint8_t *)((long)puVar44 + uVar59)) break;
      uVar59 = uVar59 + 1;
      uVar61 = uVar55;
    } while (uVar55 != uVar59);
    puVar27 = puVar27 + uVar61;
  }
  uVar55 = (long)puVar27 - (long)puVar34;
LAB_01109420:
  if (3 < uVar55) {
    iVar14 = 0x1f;
    if ((uint)pPVar46 != 0) {
      for (; (uint)pPVar46 >> iVar14 == 0; iVar14 = iVar14 + -1) {
      }
    }
    uVar59 = (ulong)(iVar14 * -0x1e + 0x780) + uVar55 * 0x87;
    if (local_188 < uVar59) {
      uVar18 = *(uint8_t *)((long)puVar3 + uVar55);
      local_150 = uVar55;
      local_188 = uVar59;
      local_158 = pPVar46;
    }
  }
LAB_0110945e:
  lVar28 = lVar28 + 1;
  if (lVar28 == 4) goto code_r0x0110946b;
  goto LAB_01109344;
code_r0x0110946b:
  *(uint *)(sVar11 + *(long *)((long)auStack_58 + (ulong)(uVar24 & 0x18)) * 4) = uVar24;
  if (uVar38 < 0x20 || ((ulong)pPVar45 & 3) != 0) goto LAB_01109656;
  pPVar46 = (params->dictionary).compound.chunks[1];
  if (pPVar46 <= pPVar45) {
    uVar53 = (uint)(params->dictionary).compound.total_size;
    iVar14 = *(int *)((long)(params->dictionary).compound.chunks + 0x14);
    iVar8 = *(int *)((params->dictionary).compound.chunks + 3);
LAB_011094ba:
    uVar42 = uVar53 & 0x3fffffff;
    bVar41 = ringbuffer[(ulong)pPVar46 & ringbuffer_mask];
    bVar6 = ringbuffer[(ulong)&pPVar46[1].source_size & ringbuffer_mask];
    if (uVar42 < 0x1000000) {
      pPVar13 = (params->dictionary).compound.chunks[0];
      uVar25 = (&pPVar13->magic)[uVar42];
      (&pPVar13->magic)[uVar42] = (uint32_t)pPVar46;
      if ((pPVar46 == pPVar45) && (uVar25 != 0xffffffff)) {
        uVar42 = uVar24 - uVar25;
        if ((PreparedDictionary *)(ulong)uVar42 <= pPVar58) {
          puVar34 = ringbuffer + (uVar25 & uVar16);
          lVar49 = 0;
          lVar28 = 0;
LAB_0110955a:
          lVar35 = lVar28;
          if (*(ulong *)((long)puVar3 + lVar35) == *(ulong *)(puVar34 + lVar35))
          goto code_r0x01109568;
          uVar59 = *(ulong *)(puVar34 + lVar35) ^ *(ulong *)((long)puVar3 + lVar35);
          uVar55 = 0;
          if (uVar59 != 0) {
            for (; (uVar59 >> uVar55 & 1) == 0; uVar55 = uVar55 + 1) {
            }
          }
          uVar55 = (uVar55 >> 3 & 0x1fffffff) + lVar35;
          goto LAB_011095e8;
        }
      }
    }
    goto LAB_01109521;
  }
  goto LAB_01109644;
code_r0x01109568:
  lVar28 = lVar35 + 8;
  lVar22 = uVar62 + lVar49;
  lVar49 = lVar49 + -8;
  if (lVar22 - 9U < 8) goto code_r0x01109582;
  goto LAB_0110955a;
code_r0x01109582:
  puVar27 = puVar34 + lVar28;
  if (lVar35 + 9U != uVar62) {
    puVar23 = (uint8_t *)(lVar28 + (long)puVar3);
    lVar28 = lVar49 + uVar62 + -1;
    puVar60 = puVar27;
    do {
      puVar27 = puVar60;
      if (*puVar60 != *puVar23) break;
      puVar23 = puVar23 + 1;
      puVar60 = puVar60 + 1;
      lVar28 = lVar28 + -1;
      puVar27 = puVar34 + (uVar62 - 1);
    } while (lVar28 != 0);
  }
  uVar55 = (long)puVar27 - (long)puVar34;
LAB_011095e8:
  if ((3 < uVar55) && (local_150 < uVar55)) {
    iVar15 = 0x1f;
    if (uVar42 != 0) {
      for (; uVar42 >> iVar15 == 0; iVar15 = iVar15 + -1) {
      }
    }
    uVar59 = (ulong)(iVar15 * -0x1e + 0x780) + uVar55 * 0x87;
    if (local_188 < uVar59) {
      local_150 = uVar55;
      local_188 = uVar59;
      local_158 = (PreparedDictionary *)(ulong)uVar42;
    }
  }
LAB_01109521:
  uVar53 = ~(uint)bVar41 * iVar8 + (uint)bVar6 + uVar53 * iVar14 + 1;
  pPVar46 = (PreparedDictionary *)&pPVar46->num_items;
  if (pPVar45 < pPVar46) goto LAB_0110963b;
  goto LAB_011094ba;
LAB_0110963b:
  *(uint *)&(params->dictionary).compound.total_size = uVar53;
LAB_01109644:
  (params->dictionary).compound.chunks[1] = (PreparedDictionary *)((long)&pPVar39->num_items + 1);
LAB_01109656:
  if (lVar37 != 0) {
    lVar28 = 0;
LAB_01109685:
    piVar12 = *(int **)(literal_context_lut + lVar28 * 8 + 0x68);
    uVar62 = ((*puVar3 << (-(char)piVar12[3] & 0x3fU)) >> (-(char)piVar12[3] & 0x3fU)) *
             0x1fe35a7bd3579bd3 >> (-*(byte *)(piVar12 + 4) & 0x3f);
    lVar49 = (1L << (*(byte *)(piVar12 + 5) & 0x3f)) * 4 + 0x18;
    lVar35 = (1L << (*(byte *)(piVar12 + 4) & 0x3f)) * 2 + lVar49;
    bVar41 = -*(byte *)(piVar12 + 5);
    puVar20 = (undefined8 *)((long)piVar12 + (ulong)(uint)piVar12[1] * 4 + lVar35);
    if (*piVar12 != -0x21431220) {
      puVar20 = (undefined8 *)*puVar20;
    }
    pPVar58 = (PreparedDictionary *)
              ((long)local_e8 + (lVar43 - *(long *)(literal_context_lut + lVar28 * 8 + 0x168)));
    uVar55 = (ulong)(uint)piVar12[2];
    uVar7 = *(ushort *)((long)piVar12 + (uVar62 & 0xffffffff) * 2 + lVar49);
    puVar29 = (uint *)((long)piVar12 +
                      (ulong)((uint)uVar7 +
                             piVar12[(ulong)((uint)((int)uVar62 << (bVar41 & 0x1f)) >>
                                            (bVar41 & 0x1f)) + 6]) * 4 + lVar35);
    lVar49 = 0;
    uVar62 = local_150;
LAB_01109764:
    pPVar46 = (PreparedDictionary *)(long)*(int *)((long)(hasher->common).extra + lVar49 * 4);
    if (((PreparedDictionary *)((long)pPVar58 - uVar55) < pPVar46) && (pPVar46 <= pPVar58)) {
      uVar59 = uVar55 - ((long)pPVar58 - (long)pPVar46);
      if (uVar38 <= uVar59) {
        uVar59 = uVar38;
      }
      lVar22 = ((long)pPVar58 - (long)pPVar46) + (long)puVar20;
      puVar44 = puVar3;
      lVar35 = lVar22;
      if (7 < uVar59) {
        lVar35 = -(long)pPVar46 - *(long *)(literal_context_lut + lVar28 * 8 + 0x168);
        lVar52 = 0;
LAB_011097a5:
        uVar61 = *(ulong *)((long)puVar20 + (long)&pPVar26->magic + lVar52 + lVar35 + lVar43);
        if (*(ulong *)((long)puVar3 + lVar52) == uVar61) goto code_r0x011097b3;
        uVar61 = uVar61 ^ *(ulong *)((long)puVar3 + lVar52);
        uVar59 = 0;
        if (uVar61 != 0) {
          for (; (uVar61 >> uVar59 & 1) == 0; uVar59 = uVar59 + 1) {
          }
        }
        uVar59 = (uVar59 >> 3 & 0x1fffffff) + lVar52;
        goto LAB_01109820;
      }
      goto LAB_011097d7;
    }
    goto LAB_01109871;
  }
LAB_01109a02:
  if (local_188 < local_178 + 0xaf) {
    local_e8 = (PreparedDictionary *)((long)&pPVar39->magic + lVar9);
    local_150 = local_110;
    pPVar45 = pPVar39;
    uVar51 = local_198;
    if (pPVar54 <= local_e8) {
      local_e8 = pPVar54;
    }
    goto LAB_01109b8c;
  }
  local_160 = local_158;
  uVar51 = uVar19;
  if (iVar50 == 3) goto LAB_01109b8c;
  local_198 = local_198 + 1;
  iVar50 = iVar50 + 1;
  puVar17 = &pPVar39->source_size;
  local_148 = local_148 - 1;
  pPVar40 = (PreparedDictionary *)((long)&pPVar40->magic + 1);
  local_178 = local_188;
  local_110 = local_150;
  pPVar39 = pPVar45;
  uVar62 = uVar38;
  uVar51 = local_198;
  if (puVar2 <= (undefined1 *)((long)puVar17 + 1U)) goto LAB_01109b8c;
  goto LAB_011090f0;
code_r0x011097b3:
  uVar59 = uVar59 - 8;
  lVar52 = lVar52 + 8;
  if (uVar59 < 8) goto code_r0x011097c1;
  goto LAB_011097a5;
code_r0x011097c1:
  puVar44 = (ulong *)(lVar52 + (long)puVar3);
  lVar35 = (long)puVar20 + (long)&pPVar26->magic + lVar52 + lVar35 + lVar43;
LAB_011097d7:
  if (uVar59 != 0) {
    uVar61 = 0;
    do {
      uVar32 = uVar61;
      if (*(char *)(lVar35 + uVar61) != *(char *)((long)puVar44 + uVar61)) break;
      uVar61 = uVar61 + 1;
      uVar32 = uVar59;
    } while (uVar59 != uVar61);
    lVar35 = lVar35 + uVar32;
  }
  uVar59 = lVar35 - lVar22;
LAB_01109820:
  if ((1 < uVar59) && (uVar61 = uVar59 * 0x87 + 0x78f, local_188 < uVar61)) {
    if (lVar49 != 0) {
      uVar61 = uVar61 - ((0x1ca10U >> ((byte)lVar49 & 2) & 4) + 0x27);
    }
    if ((local_188 < uVar61) &&
       (local_188 = uVar61, local_158 = pPVar46, local_150 = uVar59, uVar62 < uVar59)) {
      uVar62 = uVar59;
    }
  }
LAB_01109871:
  lVar49 = lVar49 + 1;
  if (lVar49 == 4) goto code_r0x0110987e;
  goto LAB_01109764;
code_r0x0110987e:
  if (uVar7 != 0xffff) {
LAB_0110988f:
    uVar24 = *puVar29;
    uVar32 = (ulong)(uVar24 & 0x7fffffff);
    pPVar46 = (PreparedDictionary *)((long)pPVar58 - uVar32);
    uVar59 = uVar55 - uVar32;
    uVar61 = uVar38;
    if (uVar59 < uVar38) {
      uVar61 = uVar59;
    }
    if ((((pPVar46 <= pPVar31) && (uVar62 + uVar51 <= ringbuffer_mask)) && (uVar62 < uVar61)) &&
       (ringbuffer[uVar62 + uVar51] == *(uint8_t *)((long)puVar20 + uVar62 + uVar32))) {
      puVar33 = (ulong *)(uVar32 + (long)puVar20);
      puVar44 = puVar3;
      puVar56 = puVar33;
      if (7 < uVar61) {
        uVar61 = uVar59;
        if (local_148 < uVar59) {
          uVar61 = local_148;
        }
        lVar49 = 0;
        puVar57 = puVar33;
LAB_01109920:
        if (*puVar44 == *puVar57) goto code_r0x0110992b;
        uVar61 = *puVar57 ^ *puVar44;
        uVar59 = 0;
        if (uVar61 != 0) {
          for (; (uVar61 >> uVar59 & 1) == 0; uVar59 = uVar59 + 1) {
          }
        }
        uVar59 = (uVar59 >> 3 & 0x1fffffff) - lVar49;
        goto LAB_01109997;
      }
      goto LAB_0110995e;
    }
    goto LAB_011098bc;
  }
LAB_011099dd:
  lVar28 = lVar28 + 1;
  if (lVar28 == lVar37) goto LAB_01109a02;
  goto LAB_01109685;
code_r0x0110992b:
  puVar44 = puVar44 + 1;
  puVar57 = puVar57 + 1;
  lVar35 = lVar49 + uVar61;
  lVar49 = lVar49 + -8;
  if (lVar35 - 8U < 8) goto code_r0x01109945;
  goto LAB_01109920;
code_r0x01109945:
  if (local_148 < uVar59) {
    uVar59 = local_148;
  }
  uVar61 = uVar59 + lVar49;
  puVar56 = puVar57;
  if (uVar61 != 0) {
LAB_0110995e:
    puVar57 = (ulong *)((long)puVar56 + uVar61);
    uVar59 = 0;
    do {
      if (*(char *)((long)puVar56 + uVar59) != *(char *)((long)puVar44 + uVar59)) {
        puVar57 = (ulong *)((long)puVar56 + uVar59);
        break;
      }
      uVar59 = uVar59 + 1;
    } while (uVar61 != uVar59);
  }
  uVar59 = (long)puVar57 - (long)puVar33;
LAB_01109997:
  if (3 < uVar59) {
    iVar14 = 0x1f;
    if ((uint)pPVar46 != 0) {
      for (; (uint)pPVar46 >> iVar14 == 0; iVar14 = iVar14 + -1) {
      }
    }
    uVar61 = (ulong)(iVar14 * -0x1e + 0x780) + uVar59 * 0x87;
    if (local_188 < uVar61) {
      uVar62 = uVar59;
      local_188 = uVar61;
      local_158 = pPVar46;
      local_150 = uVar59;
    }
  }
LAB_011098bc:
  puVar29 = puVar29 + 1;
  if ((int)uVar24 < 0) goto LAB_011099dd;
  goto LAB_0110988f;
LAB_01109b8c:
  local_198 = uVar51;
  pPVar40 = (PreparedDictionary *)((long)&local_e8->magic + lVar10);
  uVar53 = (uint)local_150;
  uVar24 = (uint)local_198;
  if (pPVar40 < local_160) {
LAB_01109ba5:
    puVar21 = (undefined1 *)((long)&local_160->hash_bits + 3);
LAB_01109ba9:
    if ((local_160 <= pPVar40) && (puVar21 != (undefined1 *)0x0)) {
      *(undefined4 *)((long)(hasher->common).extra + 0xc) =
           *(undefined4 *)((hasher->common).extra + 1);
      *(void **)((long)(hasher->common).extra + 4) = (hasher->common).extra[0];
      *(int *)(hasher->common).extra = (int)local_160;
    }
    *(uint *)local_128 = uVar24;
    *(uint *)((long)local_128 + 4) = uVar53;
    puVar1 = (undefined1 *)((ulong)*(uint *)(literal_context_lut + 0x3c) + 0x10);
    uVar42 = 0;
    if (puVar1 <= puVar21) {
      bVar41 = (byte)*(uint *)(literal_context_lut + 0x38);
      puVar30 = puVar21 + ((4L << (bVar41 & 0x3f)) - (ulong)*(uint *)(literal_context_lut + 0x3c)) +
                          -0x10;
      uVar42 = 0x1f;
      uVar25 = (uint)puVar30;
      if (uVar25 != 0) {
        for (; uVar25 >> uVar42 == 0; uVar42 = uVar42 - 1) {
        }
      }
      uVar42 = (uVar42 ^ 0xffffffe0) + 0x1f;
      uVar62 = (ulong)(((ulong)puVar30 >> ((ulong)uVar42 & 0x3f) & 1) != 0);
      lVar37 = (ulong)uVar42 - (ulong)*(uint *)(literal_context_lut + 0x38);
      puVar21 = (undefined1 *)
                ((ulong)(puVar1 + (uVar62 + lVar37 * 2 + 0xfffe << (bVar41 & 0x3f)) +
                                  (ulong)(~(-1 << (bVar41 & 0x1f)) & uVar25)) | lVar37 * 0x400);
      uVar42 = (uint)((long)puVar30 - (uVar62 + 2 << ((byte)uVar42 & 0x3f)) >> (bVar41 & 0x3f));
    }
  }
  else {
    pPVar39 = (PreparedDictionary *)(long)*(int *)(hasher->common).extra;
    if (local_160 != pPVar39) {
      pPVar31 = (PreparedDictionary *)(long)*(int *)((long)(hasher->common).extra + 4);
      puVar21 = &DAT_00000001;
      if (local_160 != pPVar31) {
        uVar62 = (long)local_160 + (3 - (long)pPVar39);
        if (uVar62 < 7) {
          bVar41 = (byte)((int)uVar62 << 2);
          uVar42 = 0x9750468;
        }
        else {
          uVar62 = (long)local_160 + (3 - (long)pPVar31);
          if (6 < uVar62) {
            puVar21 = (undefined1 *)0x2;
            if ((local_160 != (PreparedDictionary *)(long)*(int *)((hasher->common).extra + 1)) &&
               (puVar21 = (undefined1 *)0x3,
               local_160 != (PreparedDictionary *)(long)*(int *)((long)(hasher->common).extra + 0xc)
               )) goto LAB_01109ba5;
            goto LAB_01109ba9;
          }
          bVar41 = (byte)((int)uVar62 << 2);
          uVar42 = 0xfdb1ace;
        }
        puVar21 = (undefined1 *)(ulong)(uVar42 >> (bVar41 & 0x1f) & 0xf);
      }
      goto LAB_01109ba9;
    }
    *(uint *)local_128 = uVar24;
    *(uint *)((long)local_128 + 4) = uVar53;
    puVar21 = (undefined1 *)0x0;
    uVar42 = 0;
  }
  *(short *)((long)local_128 + 0xe) = (short)puVar21;
  *(uint *)(local_128 + 1) = uVar42;
  if (5 < local_198) {
    if (local_198 < 0x82) {
      uVar24 = 0x1f;
      uVar42 = (uint)(local_198 - 2);
      if (uVar42 != 0) {
        for (; uVar42 >> uVar24 == 0; uVar24 = uVar24 - 1) {
        }
      }
      uVar24 = (int)(local_198 - 2 >> ((char)(uVar24 ^ 0xffffffe0) + 0x1fU & 0x3f)) +
               (uVar24 ^ 0xffffffe0) * 2 + 0x40;
    }
    else if (local_198 < 0x842) {
      uVar42 = 0x1f;
      if (uVar24 - 0x42 != 0) {
        for (; uVar24 - 0x42 >> uVar42 == 0; uVar42 = uVar42 - 1) {
        }
      }
      uVar24 = (uVar42 ^ 0xffe0) + 0x2a;
    }
    else {
      uVar24 = 0x15;
      if (0x1841 < local_198) {
        uVar24 = (uint)(ushort)(0x17 - (local_198 < 0x5842));
      }
    }
  }
  uVar62 = (ulong)(int)uVar53;
  if (uVar62 < 10) {
    uVar42 = uVar53 - 2;
  }
  else if (uVar62 < 0x86) {
    uVar53 = 0x1f;
    uVar42 = (uint)(uVar62 - 6);
    if (uVar42 != 0) {
      for (; uVar42 >> uVar53 == 0; uVar53 = uVar53 - 1) {
      }
    }
    uVar42 = (int)(uVar62 - 6 >> ((char)(uVar53 ^ 0xffffffe0) + 0x1fU & 0x3f)) +
             (uVar53 ^ 0xffffffe0) * 2 + 0x42;
  }
  else {
    uVar42 = 0x17;
    if (uVar62 < 0x846) {
      uVar42 = 0x1f;
      if (uVar53 - 0x46 != 0) {
        for (; uVar53 - 0x46 >> uVar42 == 0; uVar42 = uVar42 - 1) {
        }
      }
      uVar42 = (uVar42 ^ 0xffe0) + 0x2c;
    }
  }
  uVar7 = (ushort)uVar42;
  sVar36 = (uVar7 & 7) + ((ushort)uVar24 & 7) * 8;
  if (((((ulong)puVar21 & 0x3ff) == 0) && ((ushort)uVar24 < 8)) && (uVar7 < 0x10)) {
    if (7 < uVar7) {
      sVar36 = sVar36 + 0x40;
    }
  }
  else {
    iVar50 = ((uVar24 & 0xffff) >> 3) * 3 + ((uVar42 & 0xffff) >> 3);
    sVar36 = sVar36 + ((ushort)(0x520d40 >> ((char)iVar50 * '\x02' & 0x1fU)) & 0xc0) +
                      (short)iVar50 * 0x40 + 0x40;
  }
  *(short *)((long)local_128 + 0xc) = sVar36;
  *num_commands = *num_commands + local_198;
  position = (long)&pPVar45->magic + local_150;
  pPVar39 = pPVar47;
  if (position < pPVar47) {
    pPVar39 = (PreparedDictionary *)position;
  }
  pPVar31 = (PreparedDictionary *)((long)&pPVar45->magic + 2);
  if (local_160 < (PreparedDictionary *)(local_150 >> 2)) {
    pPVar40 = (PreparedDictionary *)(position + (long)local_160 * -4);
    if (pPVar40 < pPVar31) {
      pPVar40 = pPVar31;
    }
    pPVar31 = pPVar40;
    if (pPVar39 < pPVar40) {
      pPVar31 = pPVar39;
    }
  }
  pPVar40 = (PreparedDictionary *)((long)&pPVar45->magic + local_150 * 2 + lVar48);
  local_128 = local_128 + 2;
  if (pPVar31 < pPVar39) {
    do {
      *(uint *)(sVar11 + (ulong)((uint)((ulong)(*(long *)(ringbuffer +
                                                         ((ulong)pPVar31 & ringbuffer_mask)) *
                                               -0x1ca5842ca8642d00) >> 0x2c) +
                                 ((uint)pPVar31 & 0x18) & 0xfffff) * 4) = (uint)pPVar31;
      pPVar31 = (PreparedDictionary *)((long)&pPVar31->magic + 1);
    } while (pPVar39 != pPVar31);
    local_198 = 0;
  }
  else {
    local_198 = 0;
  }
  goto LAB_01109f0f;
}

Assistant:

static BROTLI_NOINLINE void EXPORT_FN(CreateBackwardReferences)(
    size_t num_bytes, size_t position,
    const uint8_t* ringbuffer, size_t ringbuffer_mask,
    ContextLut literal_context_lut, const BrotliEncoderParams* params,
    Hasher* hasher, int* dist_cache, size_t* last_insert_len,
    Command* commands, size_t* num_commands, size_t* num_literals) {
  HASHER()* privat = &hasher->privat.FN(_);
  /* Set maximum distance, see section 9.1. of the spec. */
  const size_t max_backward_limit = BROTLI_MAX_BACKWARD_LIMIT(params->lgwin);
  const size_t position_offset = params->stream_offset;

  const Command* const orig_commands = commands;
  size_t insert_length = *last_insert_len;
  const size_t pos_end = position + num_bytes;
  const size_t store_end = num_bytes >= FN(StoreLookahead)() ?
      position + num_bytes - FN(StoreLookahead)() + 1 : position;

  /* For speed up heuristics for random data. */
  const size_t random_heuristics_window_size =
      LiteralSpreeLengthForSparseSearch(params);
  size_t apply_random_heuristics = position + random_heuristics_window_size;
  const size_t gap = params->dictionary.compound.total_size;

  /* Minimum score to accept a backward reference. */
  const score_t kMinScore = BROTLI_SCORE_BASE + 100;

  FN(PrepareDistanceCache)(privat, dist_cache);

  while (position + FN(HashTypeLength)() < pos_end) {
    size_t max_length = pos_end - position;
    size_t max_distance = BROTLI_MIN(size_t, position, max_backward_limit);
    size_t dictionary_start = BROTLI_MIN(size_t,
        position + position_offset, max_backward_limit);
    HasherSearchResult sr;
    int dict_id = 0;
    uint8_t p1 = 0;
    uint8_t p2 = 0;
    if (params->dictionary.contextual.context_based) {
      p1 = position >= 1 ?
          ringbuffer[(size_t)(position - 1) & ringbuffer_mask] : 0;
      p2 = position >= 2 ?
          ringbuffer[(size_t)(position - 2) & ringbuffer_mask] : 0;
      dict_id = params->dictionary.contextual.context_map[
          BROTLI_CONTEXT(p1, p2, literal_context_lut)];
    }
    sr.len = 0;
    sr.len_code_delta = 0;
    sr.distance = 0;
    sr.score = kMinScore;
    FN(FindLongestMatch)(privat, params->dictionary.contextual.dict[dict_id],
        ringbuffer, ringbuffer_mask, dist_cache, position, max_length,
        max_distance, dictionary_start + gap, params->dist.max_distance, &sr);
    if (ENABLE_COMPOUND_DICTIONARY) {
      LookupCompoundDictionaryMatch(&params->dictionary.compound, ringbuffer,
          ringbuffer_mask, dist_cache, position, max_length,
          dictionary_start, params->dist.max_distance, &sr);
    }
    if (sr.score > kMinScore) {
      /* Found a match. Let's look for something even better ahead. */
      int delayed_backward_references_in_row = 0;
      --max_length;
      for (;; --max_length) {
        const score_t cost_diff_lazy = 175;
        HasherSearchResult sr2;
        sr2.len = params->quality < MIN_QUALITY_FOR_EXTENSIVE_REFERENCE_SEARCH ?
            BROTLI_MIN(size_t, sr.len - 1, max_length) : 0;
        sr2.len_code_delta = 0;
        sr2.distance = 0;
        sr2.score = kMinScore;
        max_distance = BROTLI_MIN(size_t, position + 1, max_backward_limit);
        dictionary_start = BROTLI_MIN(size_t,
            position + 1 + position_offset, max_backward_limit);
        if (params->dictionary.contextual.context_based) {
          p2 = p1;
          p1 = ringbuffer[position & ringbuffer_mask];
          dict_id = params->dictionary.contextual.context_map[
              BROTLI_CONTEXT(p1, p2, literal_context_lut)];
        }
        FN(FindLongestMatch)(privat,
            params->dictionary.contextual.dict[dict_id],
            ringbuffer, ringbuffer_mask, dist_cache, position + 1, max_length,
            max_distance, dictionary_start + gap, params->dist.max_distance,
            &sr2);
        if (ENABLE_COMPOUND_DICTIONARY) {
          LookupCompoundDictionaryMatch(
              &params->dictionary.compound, ringbuffer,
              ringbuffer_mask, dist_cache, position + 1, max_length,
              dictionary_start, params->dist.max_distance, &sr2);
        }
        if (sr2.score >= sr.score + cost_diff_lazy) {
          /* Ok, let's just write one byte for now and start a match from the
             next byte. */
          ++position;
          ++insert_length;
          sr = sr2;
          if (++delayed_backward_references_in_row < 4 &&
              position + FN(HashTypeLength)() < pos_end) {
            continue;
          }
        }
        break;
      }
      apply_random_heuristics =
          position + 2 * sr.len + random_heuristics_window_size;
      dictionary_start = BROTLI_MIN(size_t,
          position + position_offset, max_backward_limit);
      {
        /* The first 16 codes are special short-codes,
           and the minimum offset is 1. */
        size_t distance_code = ComputeDistanceCode(
            sr.distance, dictionary_start + gap, dist_cache);
        if ((sr.distance <= (dictionary_start + gap)) && distance_code > 0) {
          dist_cache[3] = dist_cache[2];
          dist_cache[2] = dist_cache[1];
          dist_cache[1] = dist_cache[0];
          dist_cache[0] = (int)sr.distance;
          FN(PrepareDistanceCache)(privat, dist_cache);
        }
        InitCommand(commands++, &params->dist, insert_length,
            sr.len, sr.len_code_delta, distance_code);
      }
      *num_literals += insert_length;
      insert_length = 0;
      /* Put the hash keys into the table, if there are enough bytes left.
         Depending on the hasher implementation, it can push all positions
         in the given range or only a subset of them.
         Avoid hash poisoning with RLE data. */
      {
        size_t range_start = position + 2;
        size_t range_end = BROTLI_MIN(size_t, position + sr.len, store_end);
        if (sr.distance < (sr.len >> 2)) {
          range_start = BROTLI_MIN(size_t, range_end, BROTLI_MAX(size_t,
              range_start, position + sr.len - (sr.distance << 2)));
        }
        FN(StoreRange)(privat, ringbuffer, ringbuffer_mask, range_start,
                       range_end);
      }
      position += sr.len;
    } else {
      ++insert_length;
      ++position;
      /* If we have not seen matches for a long time, we can skip some
         match lookups. Unsuccessful match lookups are very very expensive
         and this kind of a heuristic speeds up compression quite
         a lot. */
      if (position > apply_random_heuristics) {
        /* Going through uncompressible data, jump. */
        if (position >
            apply_random_heuristics + 4 * random_heuristics_window_size) {
          /* It is quite a long time since we saw a copy, so we assume
             that this data is not compressible, and store hashes less
             often. Hashes of non compressible data are less likely to
             turn out to be useful in the future, too, so we store less of
             them to not to flood out the hash table of good compressible
             data. */
          const size_t kMargin =
              BROTLI_MAX(size_t, FN(StoreLookahead)() - 1, 4);
          size_t pos_jump =
              BROTLI_MIN(size_t, position + 16, pos_end - kMargin);
          for (; position < pos_jump; position += 4) {
            FN(Store)(privat, ringbuffer, ringbuffer_mask, position);
            insert_length += 4;
          }
        } else {
          const size_t kMargin =
              BROTLI_MAX(size_t, FN(StoreLookahead)() - 1, 2);
          size_t pos_jump =
              BROTLI_MIN(size_t, position + 8, pos_end - kMargin);
          for (; position < pos_jump; position += 2) {
            FN(Store)(privat, ringbuffer, ringbuffer_mask, position);
            insert_length += 2;
          }
        }
      }
    }
  }
  insert_length += pos_end - position;
  *last_insert_len = insert_length;
  *num_commands += (size_t)(commands - orig_commands);
}